

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

bool google::protobuf::compiler::java::anon_unknown_15::CheckHasBitsForEqualsAndHashCode
               (FieldDescriptor *field)

{
  bool bVar1;
  JavaType JVar2;
  FileDescriptor *descriptor;
  OneofDescriptor *pOVar3;
  undefined1 local_19;
  FieldDescriptor *field_local;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    field_local._7_1_ = false;
  }
  else {
    descriptor = FieldDescriptor::file(field);
    bVar1 = SupportFieldPresence(descriptor);
    if (bVar1) {
      field_local._7_1_ = true;
    }
    else {
      JVar2 = GetJavaType(field);
      local_19 = false;
      if (JVar2 == JAVATYPE_MESSAGE) {
        pOVar3 = FieldDescriptor::containing_oneof(field);
        local_19 = pOVar3 == (OneofDescriptor *)0x0;
      }
      field_local._7_1_ = local_19;
    }
  }
  return field_local._7_1_;
}

Assistant:

bool CheckHasBitsForEqualsAndHashCode(const FieldDescriptor* field) {
  if (field->is_repeated()) {
    return false;
  }
  if (SupportFieldPresence(field->file())) {
    return true;
  }
  return GetJavaType(field) == JAVATYPE_MESSAGE &&
      field->containing_oneof() == NULL;
}